

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

IndexPair __thiscall
slang::IntervalMap<unsigned_long,slang::ast::ValueDriver_const*,0u>::
modifyRoot<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::ValueDriver_const*,8u,true>,slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::ValueDriver_const*,8u,false>,true>
          (IntervalMap<unsigned_long,slang::ast::ValueDriver_const*,0u> *this,
          LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true> *rootNode,
          uint32_t position,allocator_type *alloc)

{
  uint32_t count;
  ulong uVar1;
  uintptr_t intWord;
  IndexPair IVar2;
  NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,slang::ast::ValueDriver_const*,8u>
  *this_00;
  uint32_t src;
  uint32_t i;
  long lVar3;
  interval<unsigned_long> iVar4;
  uint32_t sizes [2];
  NodeRef nodes [2];
  
  IVar2 = IntervalMapDetails::distribute(2,*(uint32_t *)(this + 0xc4),8,sizes,position);
  nodes[0].pip.value = (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)0;
  nodes[1].pip.value = (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)0;
  src = 0;
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    this_00 = (NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,slang::ast::ValueDriver_const*,8u>
               *)PoolAllocator<char,192ul,64ul>::
                 emplace<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::ValueDriver_const*,8u,false>>
                           ((PoolAllocator<char,192ul,64ul> *)alloc);
    count = sizes[lVar3];
    IntervalMapDetails::
    NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,slang::ast::ValueDriver_const*,8u>::
    copy<8u>(this_00,&rootNode->
                      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::ValueDriver_*,_8U>
             ,src,0,count);
    nodes[lVar3].pip.value = (ulong)this_00 & 0xffffffffffffffc0 | (ulong)(count - 1);
    src = count + src;
  }
  memset(this,0,0xc0);
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 4) {
    uVar1 = *(ulong *)((long)&nodes[0].pip.value + lVar3 * 2);
    iVar4 = IntervalMapDetails::
            NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false>_>
            ::getBounds((NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false>_>
                         *)(uVar1 & 0xffffffffffffffc0),*(uint32_t *)((long)sizes + lVar3));
    *(unsigned_long *)(this + lVar3 * 4 + 0x40) = iVar4.left;
    *(unsigned_long *)(this + lVar3 * 4 + 0x48) = iVar4.right;
    *(ulong *)(this + lVar3 * 2) = uVar1;
  }
  *(undefined4 *)(this + 0xc4) = 2;
  *(int *)(this + 0xc0) = *(int *)(this + 0xc0) + 1;
  return IVar2;
}

Assistant:

IntervalMapDetails::IndexPair IntervalMap<TKey, TValue, N>::modifyRoot(TRootNode& rootNode,
                                                                       uint32_t position,
                                                                       allocator_type& alloc) {
    using namespace IntervalMapDetails;

    // Split the root branch node into two new nodes.
    constexpr uint32_t NumNodes = 2;
    uint32_t sizes[NumNodes];
    IndexPair newOffset = distribute(NumNodes, rootSize, Leaf::Capacity, sizes, position);

    // Construct new nodes.
    uint32_t pos = 0;
    NodeRef nodes[NumNodes];
    for (uint32_t i = 0; i < NumNodes; i++) {
        auto newNode = alloc.template emplace<TNewNode>();
        uint32_t size = sizes[i];

        newNode->copy(rootNode, pos, 0, size);
        nodes[i] = NodeRef(newNode, size);
        pos += size;
    }

    if (SwitchToBranch) {
        // Destroy the old root leaf and switch it to a branch node.
        rootLeaf.~RootLeaf();
        new (&rootBranch) RootBranch();
    }

    for (uint32_t i = 0; i < NumNodes; i++) {
        rootBranch.keyAt(i) = nodes[i].template get<TNewNode>().getBounds(sizes[i]);
        rootBranch.childAt(i) = nodes[i];
    }

    rootSize = NumNodes;
    height++;
    return newOffset;
}